

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

secp256k1_context * secp256k1_context_preallocated_create(void *prealloc,uint flags)

{
  int iVar1;
  size_t sVar2;
  secp256k1_context *prealloc_00;
  secp256k1_context *psVar3;
  undefined1 *data;
  uint flags_00;
  uchar out [32];
  secp256k1_sha256 local_88;
  
  local_88.s[0] = 0x6a09e667;
  local_88.s[1] = 0xbb67ae85;
  local_88.s[2] = 0x3c6ef372;
  local_88.s[3] = 0xa54ff53a;
  local_88.s[4] = 0x510e527f;
  local_88.s[5] = 0x9b05688c;
  local_88.s[6] = 0x1f83d9ab;
  local_88.s[7] = 0x5be0cd19;
  local_88.bytes = 0;
  secp256k1_sha256_write
            (&local_88,(uchar *)"For this sample, this 63-byte string will be used as input data",
             0x3f);
  secp256k1_sha256_finalize(&local_88,out);
  data = secp256k1_selftest_sha256_output32;
  iVar1 = secp256k1_memcmp_var(out,secp256k1_selftest_sha256_output32,0x20);
  if (iVar1 == 0) {
    sVar2 = secp256k1_context_preallocated_size(flags);
    if (sVar2 == 0) {
      prealloc = (secp256k1_context *)0x0;
    }
    else {
      *(secp256k1_callback *)((long)prealloc + 0xa8) = default_illegal_callback;
      *(secp256k1_callback *)((long)prealloc + 0xb8) = default_error_callback;
      secp256k1_ecmult_gen_blind((secp256k1_ecmult_gen_context *)prealloc,(uchar *)0x0);
      *(undefined4 *)prealloc = 1;
      *(uint *)((long)prealloc + 200) = flags >> 10 & 1;
    }
    return (secp256k1_context *)prealloc;
  }
  flags_00 = 0x547aee;
  secp256k1_default_error_callback_fn("self test failed",data);
  sVar2 = secp256k1_context_preallocated_size(flags_00);
  prealloc_00 = (secp256k1_context *)checked_malloc(&default_error_callback,sVar2);
  psVar3 = secp256k1_context_preallocated_create(prealloc_00,flags_00);
  if (psVar3 == (secp256k1_context *)0x0) {
    free(prealloc_00);
    prealloc_00 = (secp256k1_context *)0x0;
  }
  return prealloc_00;
}

Assistant:

secp256k1_context* secp256k1_context_preallocated_create(void* prealloc, unsigned int flags) {
    size_t prealloc_size;
    secp256k1_context* ret;

    if (!secp256k1_selftest()) {
        secp256k1_callback_call(&default_error_callback, "self test failed");
    }

    prealloc_size = secp256k1_context_preallocated_size(flags);
    if (prealloc_size == 0) {
        return NULL;
    }
    VERIFY_CHECK(prealloc != NULL);
    ret = (secp256k1_context*)prealloc;
    ret->illegal_callback = default_illegal_callback;
    ret->error_callback = default_error_callback;

    /* Flags have been checked by secp256k1_context_preallocated_size. */
    VERIFY_CHECK((flags & SECP256K1_FLAGS_TYPE_MASK) == SECP256K1_FLAGS_TYPE_CONTEXT);
    secp256k1_ecmult_gen_context_build(&ret->ecmult_gen_ctx);
    ret->declassify = !!(flags & SECP256K1_FLAGS_BIT_CONTEXT_DECLASSIFY);

    return ret;
}